

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfactoryloader.cpp
# Opt level: O3

void __thiscall QFactoryLoader::setExtraSearchPath(QFactoryLoader *this,QString *path)

{
  QString *this_00;
  QArrayData *data;
  long lVar1;
  pointer puVar2;
  __uniq_ptr_impl<QLibraryPrivate,_QLibraryPrivate::Deleter> _Var3;
  long *plVar4;
  Data *pDVar5;
  QArrayData *data_00;
  pointer puVar6;
  QArrayData *pQVar7;
  bool bVar8;
  Type *this_01;
  bool *pbVar9;
  undefined8 uVar10;
  ulong __n;
  pointer this_03;
  ulong uVar11;
  long in_FS_OFFSET;
  QDeadlineTimer timeout;
  QStringView rhs;
  QStringView lhs;
  QArrayData *d;
  QArrayData *local_40;
  long local_38;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_factoryloader_global>_>
  *this_02;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_factoryloader_global>_>
             *)(this->d).extraSearchPath.d.size;
  if ((this_02 ==
       (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_factoryloader_global>_>
        *)(path->d).size) &&
     (rhs.m_data = (path->d).ptr, rhs.m_size = (qsizetype)this_02,
     lhs.m_data = (this->d).extraSearchPath.d.ptr, lhs.m_size = (qsizetype)this_02,
     bVar8 = QtPrivate::equalStrings(lhs,rhs), bVar8)) goto LAB_002d30bf;
  this_00 = &(this->d).extraSearchPath;
  this_01 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_factoryloader_global>_>
            ::operator->(this_02);
  timeout.t2 = 0;
  timeout.type = 1;
  timeout.t1 = 0x7fffffffffffffff;
  QRecursiveMutex::tryLock(&this_01->mutex,timeout);
  data = &((this->d).extraSearchPath.d.d)->super_QArrayData;
  (this_00->d).d = (Data *)0x0;
  (this->d).extraSearchPath.d.ptr = (char16_t *)0x0;
  lVar1 = (this->d).extraSearchPath.d.size;
  (this->d).extraSearchPath.d.size = 0;
  QString::operator=(this_00,path);
  if (lVar1 == 0) {
    Private::updateSinglePath(&this->d,this_00);
  }
  else {
    __n = (this->d).loadedLibraries.d.size;
    if (__n == 0) {
      __n = 0;
    }
    else {
      uVar11 = 0;
      do {
        if ((this->d).loadedLibraries.d.ptr[uVar11] == true) {
          puVar2 = (this->d).libraries.
                   super__Vector_base<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(this->d).libraries.
                            super__Vector_base<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3) <=
              uVar11) {
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              uVar10 = std::__throw_out_of_range_fmt
                                 ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                  ,uVar11);
              if (data != (QArrayData *)0x0) {
                LOCK();
                (data->ref_)._q_value.super___atomic_base<int>._M_i =
                     (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(data,2,0x10);
                }
              }
              QRecursiveMutex::unlock(&this_01->mutex);
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                _Unwind_Resume(uVar10);
              }
            }
            goto LAB_002d315f;
          }
          _Var3._M_t.super__Tuple_impl<0UL,_QLibraryPrivate_*,_QLibraryPrivate::Deleter>.
          super__Head_base<0UL,_QLibraryPrivate_*,_false>._M_head_impl =
               puVar2[uVar11]._M_t.super___uniq_ptr_impl<QLibraryPrivate,_QLibraryPrivate::Deleter>.
               _M_t;
          lVar1 = *(long *)((long)_Var3._M_t.
                                  super__Tuple_impl<0UL,_QLibraryPrivate_*,_QLibraryPrivate::Deleter>
                                  .super__Head_base<0UL,_QLibraryPrivate_*,_false>._M_head_impl +
                           0x48);
          if (((lVar1 != 0) && (*(int *)(lVar1 + 4) != 0)) &&
             (plVar4 = *(long **)((long)_Var3._M_t.
                                        super__Tuple_impl<0UL,_QLibraryPrivate_*,_QLibraryPrivate::Deleter>
                                        .super__Head_base<0UL,_QLibraryPrivate_*,_false>.
                                        _M_head_impl + 0x50), plVar4 != (long *)0x0)) {
            (**(code **)(*plVar4 + 0x20))();
            __n = (this->d).loadedLibraries.d.size;
          }
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 < __n);
    }
    pDVar5 = (this->d).loadedLibraries.d.d;
    uVar11 = __n;
    if (pDVar5 == (Data *)0x0) {
LAB_002d2fe1:
      local_40 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
      pbVar9 = (bool *)QArrayData::allocate1(&local_40,uVar11,KeepSize);
      pQVar7 = local_40;
      if (__n != 0) {
        memset(pbVar9,0,__n);
      }
      data_00 = &((this->d).loadedLibraries.d.d)->super_QArrayData;
      (this->d).loadedLibraries.d.d = (Data *)pQVar7;
      (this->d).loadedLibraries.d.ptr = pbVar9;
      (this->d).loadedLibraries.d.size = __n;
      if (data_00 != (QArrayData *)0x0) {
        LOCK();
        (data_00->ref_)._q_value.super___atomic_base<int>._M_i =
             (data_00->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((data_00->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(data_00,1,0x10);
        }
      }
    }
    else {
      uVar11 = (pDVar5->super_QArrayData).alloc;
      if ((1 < (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) ||
         ((long)uVar11 < (long)__n)) {
        if ((long)uVar11 <= (long)__n) {
          uVar11 = __n;
        }
        if (((pDVar5->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
             super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) == 0) {
          uVar11 = __n;
        }
        goto LAB_002d2fe1;
      }
      if (__n != 0) {
        pbVar9 = (this->d).loadedLibraries.d.ptr;
        uVar11 = 0;
        do {
          pbVar9[uVar11] = false;
          uVar11 = uVar11 + 1;
        } while (__n != uVar11);
        uVar11 = (this->d).loadedLibraries.d.size;
        if (__n < uVar11 || __n - uVar11 == 0) {
          if (__n < uVar11) {
            (this->d).loadedLibraries.d.size = __n;
          }
        }
        else {
          pbVar9 = (this->d).loadedLibraries.d.ptr;
          (this->d).loadedLibraries.d.size = __n;
          memset(pbVar9 + uVar11,0,__n - uVar11);
        }
      }
    }
    QDuplicateTracker<QString,_32UL>::clear(&(this->d).loadedPaths);
    puVar2 = (this->d).libraries.
             super__Vector_base<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar6 = (this->d).libraries.
             super__Vector_base<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    this_03 = puVar2;
    if (puVar6 != puVar2) {
      do {
        std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>::~unique_ptr(this_03);
        this_03 = this_03 + 1;
      } while (this_03 != puVar6);
      (this->d).libraries.
      super__Vector_base<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = puVar2;
    }
    std::
    _Rb_tree<QString,_std::pair<const_QString,_QLibraryPrivate_*>,_std::_Select1st<std::pair<const_QString,_QLibraryPrivate_*>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QLibraryPrivate_*>_>_>
    ::clear(&(this->d).keyMap._M_t);
    update(this);
  }
  if (data != (QArrayData *)0x0) {
    LOCK();
    (data->ref_)._q_value.super___atomic_base<int>._M_i =
         (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(data,2,0x10);
    }
  }
  QRecursiveMutex::unlock(&this_01->mutex);
LAB_002d30bf:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_002d315f:
  __stack_chk_fail();
}

Assistant:

void QFactoryLoader::setExtraSearchPath(const QString &path)
{
#if QT_CONFIG(library)
    if (d->extraSearchPath == path)
        return;             // nothing to do

    QMutexLocker locker(&qt_factoryloader_global->mutex);
    QString oldPath = std::exchange(d->extraSearchPath, path);
    if (oldPath.isEmpty()) {
        // easy case, just update this directory
        d->updateSinglePath(d->extraSearchPath);
    } else {
        // must re-scan everything
        for (qsizetype i = 0; i < d->loadedLibraries.size(); ++i) {
            if (d->loadedLibraries.at(i)) {
                auto &plugin = d->libraries.at(i);
                delete plugin->inst.data();
            }
        }
        d->loadedLibraries.fill(false);
        d->loadedPaths.clear();
        d->libraries.clear();
        d->keyMap.clear();
        update();
    }
#else
    Q_UNUSED(path);
#endif
}